

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyarrayblk.c
# Opt level: O1

void tommy_arrayblk_init(tommy_arrayblk *array)

{
  long lVar1;
  void **ppvVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (array->block).bucket_bit = 6;
  (array->block).bucket_max = 0x40;
  ppvVar2 = (void **)lrtr_calloc(0x40,8);
  (array->block).bucket[0] = ppvVar2;
  lVar3 = 1;
  do {
    (array->block).bucket[lVar3] = ppvVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  (array->block).count = 0;
  array->count = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_arrayblk_init(tommy_arrayblk* array)
{
	tommy_array_init(&array->block);

	array->count = 0;
}